

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_sample.c
# Opt level: O0

void stop_sample_instances_helper(void *object,_func_void_void_ptr *func,void *userdata)

{
  _Bool _Var1;
  ALLEGRO_SAMPLE *spl;
  void *pvVar2;
  void *in_RDX;
  code *in_RSI;
  ALLEGRO_SAMPLE_INSTANCE *in_RDI;
  ALLEGRO_SAMPLE_INSTANCE *splinst;
  ALLEGRO_SAMPLE_INSTANCE *in_stack_ffffffffffffffd8;
  
  if (in_RSI == al_destroy_sample_instance) {
    spl = al_get_sample(in_RDI);
    pvVar2 = al_get_sample_data(spl);
    if ((pvVar2 == in_RDX) &&
       (_Var1 = al_get_sample_instance_playing(in_stack_ffffffffffffffd8), _Var1)) {
      al_stop_sample_instance((ALLEGRO_SAMPLE_INSTANCE *)0x10f14e);
    }
  }
  return;
}

Assistant:

static void stop_sample_instances_helper(void *object, void (*func)(void *),
   void *userdata)
{
   ALLEGRO_SAMPLE_INSTANCE *splinst = object;

   /* This is ugly. */
   if (func == (void (*)(void *)) al_destroy_sample_instance
      && al_get_sample_data(al_get_sample(splinst)) == userdata
      && al_get_sample_instance_playing(splinst))
   {
      al_stop_sample_instance(splinst);
   }
}